

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::outputstreamtype(summarycalc *this,int summary_set)

{
  int streamtype;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  
  streamtype = 0x3000001;
  fwrite(&streamtype,4,1,(FILE *)this->fout[summary_set]);
  this->offset_[summary_set] = this->offset_[summary_set] + 4;
  local_18.__r = 1000;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_18);
  return;
}

Assistant:

void summarycalc::outputstreamtype(int summary_set)
{
	int streamtype = summarycalc_id | 1;
	fwrite(&streamtype, sizeof(streamtype), 1, fout[summary_set]);
	offset_[summary_set] += sizeof(streamtype);
	std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));
}